

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase363::run(TestCase363 *this)

{
  long *plVar1;
  PromiseFulfillerPair<int> pair;
  WaitScope waitScope;
  EventLoop loop;
  undefined8 *local_1e8;
  long *local_1e0;
  undefined8 *local_1d8;
  long *local_1d0;
  EventLoop *local_1c8;
  undefined4 local_1c0;
  EventLoop local_1b8;
  Runnable local_180;
  undefined1 *local_178;
  EventLoop **local_170;
  Maybe<kj::Exception> local_168;
  
  EventLoop::EventLoop(&local_1b8);
  local_1c0 = 0xffffffff;
  local_1c8 = &local_1b8;
  EventLoop::enterScope(&local_1b8);
  newPromiseAndFulfiller<int>();
  plVar1 = local_1d0;
  if (local_1d0 != (long *)0x0) {
    local_1d0 = (long *)0x0;
    (**(code **)*local_1d8)(local_1d8,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  local_180._vptr_Runnable = (_func_int **)&PTR_run_00451ca8;
  local_170 = &local_1c8;
  local_178 = (undefined1 *)&local_1e8;
  _::runCatchingExceptions(&local_168,&local_180);
  if (local_168.ptr.isSet == true) {
    Exception::~Exception(&local_168.ptr.field_1.value);
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[97]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x172,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { pair.promise.wait(waitScope); }) != nullptr\""
               ,(char (*) [97])
                "failed: expected ::kj::runCatchingExceptions([&]() { pair.promise.wait(waitScope); }) != nullptr"
              );
  }
  plVar1 = local_1d0;
  if (local_1d0 != (long *)0x0) {
    local_1d0 = (long *)0x0;
    (**(code **)*local_1d8)(local_1d8,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  plVar1 = local_1e0;
  if (local_1e0 != (long *)0x0) {
    local_1e0 = (long *)0x0;
    (**(code **)*local_1e8)(local_1e8,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  EventLoop::leaveScope(local_1c8);
  EventLoop::~EventLoop(&local_1b8);
  return;
}

Assistant:

TEST(Async, SeparateFulfillerDiscarded) {
  EventLoop loop;
  WaitScope waitScope(loop);

  auto pair = newPromiseAndFulfiller<int>();
  pair.fulfiller = nullptr;

  EXPECT_ANY_THROW(pair.promise.wait(waitScope));
}